

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::updatePalette(QGraphicsScenePrivate *this,QPalette *palette)

{
  bool bVar1;
  uint uVar2;
  QObject *pQVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  QPalette *in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsScene *q;
  QEvent event;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  SortOrder order;
  QGraphicsItem *pQVar7;
  QGraphicsScene *in_stack_ffffffffffffff98;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QGraphicsItem **local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  order = (SortOrder)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(in_RDI)->super_QObject;
  QPalette::operator=(&in_RDI->palette,in_RSI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items(in_stack_ffffffffffffff98,order);
  local_28.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff80);
  local_30.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff80);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_28,local_30);
    if (!bVar1) break;
    ppQVar4 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_28);
    pQVar7 = *ppQVar4;
    pQVar5 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c96b2);
    if (pQVar5 == (QGraphicsItem *)0x0) {
      pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar7->d_ptr);
      uVar2 = QPalette::resolveMask();
      (*pQVar6->_vptr_QGraphicsItemPrivate[6])(pQVar6,(ulong)uVar2);
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_28);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,PaletteChange);
  QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c9730);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updatePalette(const QPalette &palette)
{
    Q_Q(QGraphicsScene);

    // Update local palette setting.
    this->palette = palette;

    // Resolve the palettes of all top-level widget items, or widget items
    // whose parent is not a widget.
    const auto items = q->items();
    for (QGraphicsItem *item : items) {
        if (!item->parentItem()) {
            // ResolvePalette for an item is a noop operation, but
            // every item can be a widget, or can have a widget
            // children.
            item->d_ptr->resolvePalette(palette.resolveMask());
        }
    }

    // Send the scene a PaletteChange event.
    QEvent event(QEvent::PaletteChange);
    QCoreApplication::sendEvent(q, &event);
}